

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

long PSGPitchConvert(long pitch)

{
  ulong local_18;
  long value;
  long pitch_local;
  
  if ((target_driver < 3) || (2 < source_driver)) {
    local_18 = pitch;
    if ((target_driver < 3) && (2 < source_driver)) {
      local_18 = pitch - 0xcU & 0xff;
    }
  }
  else {
    local_18 = pitch + 0xcU & 0xff;
  }
  return local_18;
}

Assistant:

static long PSGPitchConvert(long pitch)
{
	long value;

	if (target_driver >= 3 && source_driver < 3)
		value = (pitch + PSG_DELTA) & 0xFF;
	else if (target_driver < 3 && source_driver >= 3)
		value = (pitch - PSG_DELTA) & 0xFF;
	else
		value = pitch;

	return value;
}